

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

void __thiscall QTemporaryDirPrivate::create(QTemporaryDirPrivate *this,QString *templateName)

{
  uint uVar1;
  int *piVar2;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  int code;
  int exists;
  int i;
  QFlags<QFileDevice::Permission> perms;
  QTemporaryFileName tfn;
  QFileSystemEntry fileSystemEntry;
  QString *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int in_stack_ffffffffffffff04;
  int local_f4;
  QTemporaryFileName *in_stack_ffffffffffffff10;
  int local_dc;
  QString *in_stack_ffffffffffffff58;
  QTemporaryFileName *in_stack_ffffffffffffff60;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_78,0,0x28);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QTemporaryFileName::QTemporaryFileName(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_dc = 0;
  do {
    if (0xff < local_dc) {
LAB_002f6638:
      qt_error_string((int)((ulong)in_RDI >> 0x20));
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      QString::~QString((QString *)0x2f6662);
      *(undefined1 *)((long)&(in_RDI->m_nativeFilePath).d.d + 1) = 0;
LAB_002f6673:
      QTemporaryFileName::~QTemporaryFileName((QTemporaryFileName *)0x2f6680);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QTemporaryFileName::generateNext(in_stack_ffffffffffffff10);
    QByteArray::~QByteArray((QByteArray *)0x2f64d7);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry
              (in_RDI,(NativePath *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0));
    std::optional<QFlags<QFileDevice::Permission>_>::
    optional<const_QFlags<QFileDevice::Permission>_&,_true>
              ((optional<QFlags<QFileDevice::Permission>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (QFlags<QFileDevice::Permission> *)in_stack_fffffffffffffee8);
    uVar1 = QFileSystemEngine::mkdir((char *)&local_48,(__mode_t)local_50);
    in_stack_fffffffffffffef4 = CONCAT13((char)uVar1,(int3)in_stack_fffffffffffffef4);
    if ((uVar1 & 1) == 0) {
      piVar2 = __errno_location();
      in_stack_ffffffffffffff04 = *piVar2;
      if (in_stack_ffffffffffffff04 == 0x11) {
        local_f4 = 0;
      }
      else {
        local_f4 = 2;
      }
    }
    else {
      *(undefined1 *)((long)&(in_RDI->m_nativeFilePath).d.d + 1) = 1;
      QFileSystemEntry::filePath(in_RDI);
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
      QString::~QString((QString *)0x2f658f);
      local_f4 = 1;
    }
    QFileSystemEntry::~QFileSystemEntry
              ((QFileSystemEntry *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    in_stack_fffffffffffffef0 = local_f4;
    if (local_f4 != 0) {
      if (local_f4 != 2) goto LAB_002f6673;
      goto LAB_002f6638;
    }
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

void QTemporaryDirPrivate::create(const QString &templateName)
{
    QTemporaryFileName tfn(templateName);
    constexpr auto perms = QFile::ReadOwner | QFile::WriteOwner | QFile::ExeOwner;
    for (int i = 0; i < 256; ++i) {
        tfn.generateNext();
        QFileSystemEntry fileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
        if (QFileSystemEngine::mkdir(fileSystemEntry, perms)) {
            success = true;
            pathOrError = fileSystemEntry.filePath();
            return;
        }
#  ifdef Q_OS_WIN
        const int exists = ERROR_ALREADY_EXISTS;
        int code = GetLastError();
#  else
        const int exists = EEXIST;
        int code = errno;
#  endif
        if (code != exists)
            break;
    }
    pathOrError = qt_error_string();
    success = false;
}